

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ProcessRows(VP8LDecoder *dec,int row)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int in_ESI;
  long in_RDI;
  int num_rows_out;
  uint8_t *rgba;
  WebPRGBABuffer *buf;
  WebPDecBuffer *output;
  int in_stride;
  uint8_t *rows_data;
  VP8Io *io;
  int num_rows;
  uint32_t *rows;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  VP8LDecoder *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  uint32_t *in_stack_ffffffffffffffc0;
  VP8LDecoder *dec_00;
  WEBP_CSP_MODE colorspace;
  int in_stack_ffffffffffffffc8;
  int start_row;
  VP8LDecoder *dec_01;
  VP8Io *io_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = in_ESI - *(int *)(in_RDI + 0x8c);
  if (0 < iVar1) {
    io_00 = *(VP8Io **)(in_RDI + 8);
    dec_01 = *(VP8LDecoder **)(in_RDI + 0x20);
    start_row = io_00->width << 2;
    ApplyInverseTransforms(dec_01,start_row,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    iVar2 = SetCropWindow(io_00,*(int *)(in_RDI + 0x8c),in_ESI,(uint8_t **)&stack0xffffffffffffffd0,
                          start_row);
    if (iVar2 != 0) {
      dec_00 = *(VP8LDecoder **)(in_RDI + 0x10);
      iVar2 = WebPIsRGBMode(dec_00->status_);
      if (iVar2 == 0) {
        if (io_00->use_scaling == 0) {
          iVar1 = EmitRowsYUVA(in_stack_ffffffffffffffb0,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff9c);
        }
        else {
          iVar1 = EmitRescaledRowsYUVA
                            (dec_00,in_stack_ffffffffffffffb8,
                             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                             (int)in_stack_ffffffffffffffb0);
        }
        *(int *)(in_RDI + 0x94) = iVar1;
      }
      else {
        lVar3 = (long)dec_00->output_->pad +
                (long)*(int *)(in_RDI + 0x94) * (long)*(int *)&dec_00->pixels_ + -0x60;
        colorspace = (WEBP_CSP_MODE)((ulong)dec_00 >> 0x20);
        if (io_00->use_scaling == 0) {
          iVar1 = EmitRows(colorspace,(uint8_t *)&dec_00->output_,(int)((ulong)lVar3 >> 0x20),
                           (int)lVar3,in_stack_ffffffffffffffac,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (int)dec_01);
        }
        else {
          iVar1 = EmitRescaledRowsRGBA
                            ((VP8LDecoder *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                             (uint8_t *)io_00,(int)((ulong)dec_01 >> 0x20),(int)dec_01,
                             (uint8_t *)CONCAT44(start_row,in_stack_ffffffffffffffc8),colorspace);
        }
        *(int *)(in_RDI + 0x94) = iVar1 + *(int *)(in_RDI + 0x94);
      }
    }
  }
  *(int *)(in_RDI + 0x8c) = in_ESI;
  return;
}

Assistant:

static void ProcessRows(VP8LDecoder* const dec, int row) {
  const uint32_t* const rows = dec->pixels_ + dec->width_ * dec->last_row_;
  const int num_rows = row - dec->last_row_;

  assert(row <= dec->io_->crop_bottom);
  // We can't process more than NUM_ARGB_CACHE_ROWS at a time (that's the size
  // of argb_cache_), but we currently don't need more than that.
  assert(num_rows <= NUM_ARGB_CACHE_ROWS);
  if (num_rows > 0) {    // Emit output.
    VP8Io* const io = dec->io_;
    uint8_t* rows_data = (uint8_t*)dec->argb_cache_;
    const int in_stride = io->width * sizeof(uint32_t);  // in unit of RGBA
    ApplyInverseTransforms(dec, dec->last_row_, num_rows, rows);
    if (!SetCropWindow(io, dec->last_row_, row, &rows_data, in_stride)) {
      // Nothing to output (this time).
    } else {
      const WebPDecBuffer* const output = dec->output_;
      if (WebPIsRGBMode(output->colorspace)) {  // convert to RGBA
        const WebPRGBABuffer* const buf = &output->u.RGBA;
        uint8_t* const rgba =
            buf->rgba + (int64_t)dec->last_out_row_ * buf->stride;
        const int num_rows_out =
#if !defined(WEBP_REDUCE_SIZE)
         io->use_scaling ?
            EmitRescaledRowsRGBA(dec, rows_data, in_stride, io->mb_h,
                                 rgba, buf->stride) :
#endif  // WEBP_REDUCE_SIZE
            EmitRows(output->colorspace, rows_data, in_stride,
                     io->mb_w, io->mb_h, rgba, buf->stride);
        // Update 'last_out_row_'.
        dec->last_out_row_ += num_rows_out;
      } else {                              // convert to YUVA
        dec->last_out_row_ = io->use_scaling ?
            EmitRescaledRowsYUVA(dec, rows_data, in_stride, io->mb_h) :
            EmitRowsYUVA(dec, rows_data, in_stride, io->mb_w, io->mb_h);
      }
      assert(dec->last_out_row_ <= output->height);
    }
  }

  // Update 'last_row_'.
  dec->last_row_ = row;
  assert(dec->last_row_ <= dec->height_);
}